

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist.c
# Opt level: O2

psize p_list_length(PList *list)

{
  psize pVar1;
  
  pVar1 = 0;
  for (; list != (PList *)0x0; list = list->next) {
    pVar1 = pVar1 + 1;
  }
  return pVar1;
}

Assistant:

P_LIB_API psize
p_list_length (const PList *list)
{
	const PList	*cur;
	psize		ret;

	if (P_UNLIKELY (list == NULL))
		return 0;

	for (cur = list, ret = 1; cur->next != NULL; cur = cur->next, ++ret)
		;

	return ret;
}